

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferActiveUniformValidationVSFS::configureProgram
          (TextureBufferActiveUniformValidationVSFS *this,
          vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params,
          GLuint *texIds)

{
  GLuint GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ulong uVar6;
  size_type sVar7;
  reference this_00;
  undefined8 uVar8;
  TestError *this_01;
  string local_50;
  int local_30;
  uint local_2c;
  GLint location;
  GLuint i;
  Functions *gl;
  GLuint *texIds_local;
  vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params_local;
  TextureBufferActiveUniformValidationVSFS *this_local;
  
  gl = (Functions *)texIds;
  texIds_local = (GLuint *)params;
  params_local = (vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *)this
  ;
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.
                      m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  _location = CONCAT44(extraout_var,iVar3);
  local_2c = 0;
  while( true ) {
    uVar6 = (ulong)local_2c;
    sVar7 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                      ((vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                        *)texIds_local);
    if (sVar7 <= uVar6) {
      return;
    }
    pcVar2 = *(code **)(_location + 0xb48);
    GVar1 = (this->super_TextureBufferActiveUniformValidation).m_po_id;
    this_00 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::
              operator[]((vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                          *)texIds_local,(ulong)local_2c);
    TextureParameters::get_uniform_name_abi_cxx11_(&local_50,this_00);
    uVar8 = std::__cxx11::string::c_str();
    iVar3 = (*pcVar2)(GVar1,uVar8);
    std::__cxx11::string::~string((string *)&local_50);
    local_30 = iVar3;
    dVar4 = (**(code **)(_location + 0x800))();
    glu::checkError(dVar4,"Error getting uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x22f);
    if (local_30 == -1) break;
    (**(code **)(_location + 8))(local_2c + 0x84c0);
    dVar4 = (**(code **)(_location + 0x800))();
    glu::checkError(dVar4,"Error activating texture unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x236);
    (**(code **)(_location + 0xb8))
              ((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_glExtTokens.
               TEXTURE_BUFFER,*(undefined4 *)((long)&gl->activeShaderProgram + (ulong)local_2c * 4))
    ;
    dVar4 = (**(code **)(_location + 0x800))();
    glu::checkError(dVar4,"Error binding texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x238);
    (**(code **)(_location + 0x14f0))(local_30,local_2c);
    dVar4 = (**(code **)(_location + 0x800))();
    glu::checkError(dVar4,"Error setting value for uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x23a);
    local_2c = local_2c + 1;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Could not get uniform location for active uniform variable",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
             ,0x232);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TextureBufferActiveUniformValidationVSFS::configureProgram(std::vector<TextureParameters>* params,
																glw::GLuint*					texIds)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (glw::GLuint i = 0; i < params->size(); ++i)
	{
		glw::GLint location = gl.getUniformLocation(m_po_id, (*params)[i].get_uniform_name().c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting uniform location!");
		if (location == -1)
		{
			TCU_FAIL("Could not get uniform location for active uniform variable");
		}

		gl.activeTexture(GL_TEXTURE0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error activating texture unit!");
		gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, texIds[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");
		gl.uniform1i(location, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for uniform location!");
	}
}